

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_ascii_from_fixed(png_const_structrp png_ptr,png_charp ascii,size_t size,png_fixed_point fp)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint local_44;
  uint i;
  uint tmp;
  char digits [10];
  uint first;
  uint ndigits;
  png_uint_32 num;
  png_fixed_point fp_local;
  size_t size_local;
  png_charp ascii_local;
  png_const_structrp png_ptr_local;
  
  if (0xc < size) {
    first = fp;
    size_local = (size_t)ascii;
    if (fp < 0) {
      size_local = (size_t)(ascii + 1);
      *ascii = '-';
      first = -fp;
    }
    if (first < 0x80000001) {
      digits[6] = '\0';
      digits[7] = '\0';
      digits[8] = '\0';
      digits[9] = '\0';
      digits[2] = '\x10';
      digits[3] = '\0';
      digits[4] = '\0';
      digits[5] = '\0';
      memset((void *)((long)&i + 2),0,10);
      while (first != 0) {
        uVar1 = first / 10;
        uVar2 = first % 10;
        uVar3 = (ulong)(uint)digits._6_4_;
        digits._6_4_ = digits._6_4_ + 1;
        *(char *)((long)&i + uVar3 + 2) = (char)uVar2 + '0';
        first = uVar1;
        if ((digits._2_4_ == 0x10) && (uVar2 != 0)) {
          digits[2] = digits[6];
          digits[3] = digits[7];
          digits[4] = digits[8];
          digits[5] = digits[9];
        }
      }
      if (digits._6_4_ == 0) {
        *(undefined1 *)size_local = 0x30;
        size_local = size_local + 1;
      }
      else {
        while (5 < (uint)digits._6_4_) {
          digits._6_4_ = digits._6_4_ - 1;
          *(undefined1 *)size_local = *(undefined1 *)((long)&i + (ulong)(uint)digits._6_4_ + 2);
          size_local = size_local + 1;
        }
        if ((uint)digits._2_4_ < 6) {
          *(undefined1 *)size_local = 0x2e;
          for (local_44 = 5; size_local = size_local + 1, (uint)digits._6_4_ < local_44;
              local_44 = local_44 - 1) {
            *(undefined1 *)size_local = 0x30;
          }
          while ((uint)digits._2_4_ <= (uint)digits._6_4_) {
            digits._6_4_ = digits._6_4_ - 1;
            *(undefined1 *)size_local = *(undefined1 *)((long)&i + (ulong)(uint)digits._6_4_ + 2);
            size_local = size_local + 1;
          }
        }
      }
      *(undefined1 *)size_local = 0;
      return;
    }
  }
  png_error(png_ptr,"ASCII conversion buffer too small");
}

Assistant:

void /* PRIVATE */
png_ascii_from_fixed(png_const_structrp png_ptr, png_charp ascii,
    size_t size, png_fixed_point fp)
{
   /* Require space for 10 decimal digits, a decimal point, a minus sign and a
    * trailing \0, 13 characters:
    */
   if (size > 12)
   {
      png_uint_32 num;

      /* Avoid overflow here on the minimum integer. */
      if (fp < 0)
      {
         *ascii++ = 45; num = (png_uint_32)(-fp);
      }
      else
         num = (png_uint_32)fp;

      if (num <= 0x80000000) /* else overflowed */
      {
         unsigned int ndigits = 0, first = 16 /* flag value */;
         char digits[10] = {0};

         while (num)
         {
            /* Split the low digit off num: */
            unsigned int tmp = num/10;
            num -= tmp*10;
            digits[ndigits++] = (char)(48 + num);
            /* Record the first non-zero digit, note that this is a number
             * starting at 1, it's not actually the array index.
             */
            if (first == 16 && num > 0)
               first = ndigits;
            num = tmp;
         }

         if (ndigits > 0)
         {
            while (ndigits > 5) *ascii++ = digits[--ndigits];
            /* The remaining digits are fractional digits, ndigits is '5' or
             * smaller at this point.  It is certainly not zero.  Check for a
             * non-zero fractional digit:
             */
            if (first <= 5)
            {
               unsigned int i;
               *ascii++ = 46; /* decimal point */
               /* ndigits may be <5 for small numbers, output leading zeros
                * then ndigits digits to first:
                */
               i = 5;
               while (ndigits < i)
               {
                  *ascii++ = 48; --i;
               }
               while (ndigits >= first) *ascii++ = digits[--ndigits];
               /* Don't output the trailing zeros! */
            }
         }
         else
            *ascii++ = 48;

         /* And null terminate the string: */
         *ascii = 0;
         return;
      }
   }

   /* Here on buffer too small. */
   png_error(png_ptr, "ASCII conversion buffer too small");
}